

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcore_unix.cpp
# Opt level: O0

QByteArray * qt_readlink(char *path)

{
  char *__buf;
  size_t sVar1;
  qsizetype qVar2;
  int *piVar3;
  char *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  ssize_t len;
  QByteArray buf;
  QByteArray *in_stack_ffffffffffffff58;
  QByteArray *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  QByteArray *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  qsizetype in_stack_ffffffffffffff80;
  long lVar4;
  long local_40;
  QByteArray local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray
            (in_RDI,in_stack_ffffffffffffff80,
             (Initialization)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  __buf = QByteArray::data(in_stack_ffffffffffffff60);
  sVar1 = QByteArray::size(&local_28);
  local_40 = readlink(in_RSI,__buf,sVar1);
  do {
    lVar4 = local_40;
    qVar2 = QByteArray::size(&local_28);
    if (lVar4 != qVar2) {
      if (local_40 == -1) {
        QByteArray::QByteArray((QByteArray *)0x6acf7c);
      }
      else {
        QByteArray::resize(in_stack_ffffffffffffff70,(qsizetype)in_stack_ffffffffffffff68);
        QByteArray::QByteArray(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
LAB_006acfb4:
      QByteArray::~QByteArray((QByteArray *)0x6acfc1);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return in_RDI;
      }
      __stack_chk_fail();
    }
    qVar2 = QByteArray::size(&local_28);
    if (0xfff < qVar2) {
      piVar3 = __errno_location();
      *piVar3 = 0x24;
      QByteArray::QByteArray((QByteArray *)0x6acece);
      goto LAB_006acfb4;
    }
    QByteArray::size(&local_28);
    QByteArray::resize(in_stack_ffffffffffffff70,(qsizetype)in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff68 = in_RSI;
    in_stack_ffffffffffffff70 = (QByteArray *)QByteArray::data(in_stack_ffffffffffffff60);
    sVar1 = QByteArray::size(&local_28);
    local_40 = readlink(in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff70,sVar1);
  } while( true );
}

Assistant:

QByteArray qt_readlink(const char *path)
{
#ifndef PATH_MAX
    // suitably large value that won't consume too much memory
#  define PATH_MAX  1024*1024
#endif

    QByteArray buf(256, Qt::Uninitialized);

    ssize_t len = ::readlink(path, buf.data(), buf.size());
    while (len == buf.size()) {
        // readlink(2) will fill our buffer and not necessarily terminate with NUL;
        if (buf.size() >= PATH_MAX) {
            errno = ENAMETOOLONG;
            return QByteArray();
        }

        // double the size and try again
        buf.resize(buf.size() * 2);
        len = ::readlink(path, buf.data(), buf.size());
    }

    if (len == -1)
        return QByteArray();

    buf.resize(len);
    return buf;
}